

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void embree::deleteGeometry(ISPCGeometry *geom)

{
  ISPCQuadMesh *in_RDI;
  ISPCInstanceArray *in_stack_ffffffffffffffb0;
  ISPCTriangleMesh *in_stack_ffffffffffffffc0;
  ISPCSubdivMesh *in_stack_ffffffffffffffd0;
  
  if (in_RDI != (ISPCQuadMesh *)0x0) {
    switch((in_RDI->geom).type) {
    case TRIANGLE_MESH:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCTriangleMesh::~ISPCTriangleMesh(in_stack_ffffffffffffffc0);
        ISPCTriangleMesh::operator_delete((void *)0x189e05);
      }
      break;
    case SUBDIV_MESH:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCSubdivMesh::~ISPCSubdivMesh(in_stack_ffffffffffffffd0);
        ISPCSubdivMesh::operator_delete((void *)0x189e2e);
      }
      break;
    case CURVES:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCHairSet::~ISPCHairSet((ISPCHairSet *)in_stack_ffffffffffffffd0);
        ISPCHairSet::operator_delete((void *)0x189ef8);
      }
      break;
    case INSTANCE:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCInstance::~ISPCInstance((ISPCInstance *)in_stack_ffffffffffffffb0);
        ISPCInstance::operator_delete((void *)0x189e57);
      }
      break;
    case INSTANCE_ARRAY:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCInstanceArray::~ISPCInstanceArray(in_stack_ffffffffffffffb0);
        ISPCInstanceArray::operator_delete((void *)0x189e80);
      }
      break;
    case GROUP:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCGroup::~ISPCGroup((ISPCGroup *)in_stack_ffffffffffffffb0);
        ISPCGroup::operator_delete((void *)0x189ea9);
      }
      break;
    case QUAD_MESH:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCQuadMesh::~ISPCQuadMesh(in_RDI);
        ISPCQuadMesh::operator_delete((void *)0x189ed2);
      }
      break;
    case GRID_MESH:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCGridMesh::~ISPCGridMesh((ISPCGridMesh *)in_RDI);
        ISPCGridMesh::operator_delete((void *)0x189f1e);
      }
      break;
    case POINTS:
      if (in_RDI != (ISPCQuadMesh *)0x0) {
        ISPCPointSet::~ISPCPointSet((ISPCPointSet *)in_stack_ffffffffffffffc0);
        ISPCPointSet::operator_delete((void *)0x189f41);
      }
    }
  }
  return;
}

Assistant:

void deleteGeometry(ISPCGeometry* geom)
  {
    if (geom == nullptr)
      return;
    
    switch (geom->type) {
    case TRIANGLE_MESH: delete (ISPCTriangleMesh*) geom; break;
    case SUBDIV_MESH  : delete (ISPCSubdivMesh*) geom; break;
    case INSTANCE: delete (ISPCInstance*) geom; break;
    case INSTANCE_ARRAY: delete (ISPCInstanceArray*) geom; break;
    case GROUP: delete (ISPCGroup*) geom; break;
    case QUAD_MESH: delete (ISPCQuadMesh*) geom; break;
    case CURVES: delete (ISPCHairSet*) geom; break;
    case GRID_MESH: delete (ISPCGridMesh*) geom; break;
    case POINTS: delete (ISPCPointSet*) geom; break;
    default: assert(false); break;
    }
  }